

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O3

bool getLine(char *buff,int *buff_p,string *line)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x10f2d3);
  iVar3 = *buff_p;
  lVar4 = (long)iVar3;
  cVar1 = buff[lVar4];
  cVar2 = cVar1;
  if (cVar1 != '\0') {
    while (cVar2 != '\n') {
      *buff_p = (int)lVar4 + 1;
      std::__cxx11::string::push_back((char)line);
      iVar3 = *buff_p;
      lVar4 = (long)iVar3;
      cVar2 = buff[lVar4];
    }
    *buff_p = iVar3 + 1;
  }
  return cVar1 != '\0';
}

Assistant:

bool getLine(char* buff, int& buff_p, string& line){
    line = "";
    if(buff[buff_p] == 0) return false;
    while(buff[buff_p] != '\n'){
        line += buff[buff_p++];
    }
    buff_p++;
    return true;
}